

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O3

RK_S32 get_smallest_poc(H264_DpbBuf_t *p_Dpb,RK_S32 *poc,RK_S32 *pos)

{
  int iVar1;
  h264_frame_store_t **pphVar2;
  RK_S32 RVar3;
  int iVar4;
  int iVar5;
  RK_S32 RVar6;
  RK_U32 RVar7;
  ulong uVar8;
  
  *pos = -1;
  *poc = 0x7fffffff;
  RVar7 = p_Dpb->used_size;
  if (RVar7 == 0) {
    RVar6 = -1;
    iVar5 = 0x7fffffff;
  }
  else {
    pphVar2 = p_Dpb->fs;
    uVar8 = 0;
    RVar6 = -1;
    iVar5 = 0x7fffffff;
    iVar4 = 0;
    do {
      iVar1 = pphVar2[uVar8]->poc;
      RVar3 = (RK_S32)uVar8;
      if (iVar5 <= iVar1) {
        RVar3 = RVar6;
      }
      RVar6 = RVar3;
      if (iVar1 <= iVar5) {
        iVar5 = iVar1;
      }
      if ((iVar1 < *poc) && (pphVar2[uVar8]->is_output == 0)) {
        *poc = iVar1;
        *pos = (RK_S32)uVar8;
        RVar7 = p_Dpb->used_size;
        iVar4 = 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < RVar7);
    if (iVar4 != 0) {
      return iVar4;
    }
  }
  *poc = iVar5;
  *pos = RVar6;
  return 0;
}

Assistant:

static RK_S32 get_smallest_poc(H264_DpbBuf_t *p_Dpb, RK_S32 *poc, RK_S32 *pos)
{
    RK_U32 i = 0;
    RK_S32 find_flag = 0;
    RK_S32 min_pos = -1;
    RK_S32 min_poc = INT_MAX;

    *pos = -1;
    *poc = INT_MAX;
    for (i = 0; i < p_Dpb->used_size; i++) {
        if (min_poc > p_Dpb->fs[i]->poc) {
            min_poc = p_Dpb->fs[i]->poc;
            min_pos = i;
        }
        if ((*poc > p_Dpb->fs[i]->poc) && (!p_Dpb->fs[i]->is_output)) {
            *poc = p_Dpb->fs[i]->poc;
            *pos = i;
            find_flag = 1;
        }
    }
    if (!find_flag) {
        *poc = min_poc;
        *pos = min_pos;
    }

    return find_flag;
}